

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_70(QPDF *pdf,char *arg2)

{
  QPDFWriter local_b8 [8];
  QPDFWriter w;
  allocator<char> local_a1;
  string local_a0 [32];
  QPDFObjectHandle local_80 [2];
  allocator<char> local_59;
  string local_58 [32];
  QPDFObjectHandle local_38;
  undefined1 local_28 [8];
  QPDFObjectHandle trailer;
  char *arg2_local;
  QPDF *pdf_local;
  
  trailer.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)arg2;
  QPDF::getTrailer();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58,"/S1",&local_59);
  QPDFObjectHandle::getKey((string *)&local_38);
  QPDFObjectHandle::setFilterOnWrite(SUB81(&local_38,0));
  QPDFObjectHandle::~QPDFObjectHandle(&local_38);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a0,"/S2",&local_a1);
  QPDFObjectHandle::getKey((string *)local_80);
  QPDFObjectHandle::setFilterOnWrite(SUB81(local_80,0));
  QPDFObjectHandle::~QPDFObjectHandle(local_80);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator(&local_a1);
  QPDFWriter::QPDFWriter(local_b8,pdf,"a.pdf");
  QPDFWriter::setStaticID(SUB81(local_b8,0));
  QPDFWriter::setDecodeLevel((qpdf_stream_decode_level_e)local_b8);
  QPDFWriter::write();
  QPDFWriter::~QPDFWriter(local_b8);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_28);
  return;
}

Assistant:

static void
test_70(QPDF& pdf, char const* arg2)
{
    auto trailer = pdf.getTrailer();
    trailer.getKey("/S1").setFilterOnWrite(false);
    trailer.getKey("/S2").setFilterOnWrite(false);
    QPDFWriter w(pdf, "a.pdf");
    w.setStaticID(true);
    w.setDecodeLevel(qpdf_dl_specialized);
    w.write();
}